

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O3

btCollisionShape * __thiscall
btCollisionWorldImporter::createBoxShape(btCollisionWorldImporter *this,btVector3 *halfExtents)

{
  btCollisionShape **ptr;
  uint uVar1;
  btCollisionShape *this_00;
  btCollisionShape **ppbVar2;
  ulong uVar3;
  int iVar4;
  
  this_00 = (btCollisionShape *)btAlignedAllocInternal(0x50,0x10);
  btBoxShape::btBoxShape((btBoxShape *)this_00,halfExtents);
  uVar1 = (this->m_allocatedCollisionShapes).m_size;
  if (uVar1 == (this->m_allocatedCollisionShapes).m_capacity) {
    iVar4 = 1;
    if (uVar1 != 0) {
      iVar4 = uVar1 * 2;
    }
    if ((int)uVar1 < iVar4) {
      if (iVar4 == 0) {
        ppbVar2 = (btCollisionShape **)0x0;
      }
      else {
        ppbVar2 = (btCollisionShape **)btAlignedAllocInternal((long)iVar4 << 3,0x10);
        uVar1 = (this->m_allocatedCollisionShapes).m_size;
      }
      if (0 < (int)uVar1) {
        uVar3 = 0;
        do {
          ppbVar2[uVar3] = (this->m_allocatedCollisionShapes).m_data[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
      }
      ptr = (this->m_allocatedCollisionShapes).m_data;
      if ((ptr != (btCollisionShape **)0x0) &&
         ((this->m_allocatedCollisionShapes).m_ownsMemory == true)) {
        btAlignedFreeInternal(ptr);
        uVar1 = (this->m_allocatedCollisionShapes).m_size;
      }
      (this->m_allocatedCollisionShapes).m_ownsMemory = true;
      (this->m_allocatedCollisionShapes).m_data = ppbVar2;
      (this->m_allocatedCollisionShapes).m_capacity = iVar4;
    }
  }
  (this->m_allocatedCollisionShapes).m_data[(int)uVar1] = this_00;
  (this->m_allocatedCollisionShapes).m_size = uVar1 + 1;
  return this_00;
}

Assistant:

btCollisionShape* btCollisionWorldImporter::createBoxShape(const btVector3& halfExtents)
{
	btBoxShape* shape = new btBoxShape(halfExtents);
	m_allocatedCollisionShapes.push_back(shape);
	return shape;
}